

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::Exception::extendTrace(Exception *this,uint ignoreCount)

{
  uint uVar1;
  size_t sVar2;
  kj *this_00;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> end;
  void **__src;
  size_t size;
  ArrayPtr<void_*> AVar3;
  ArrayPtr<void_*const> AVar4;
  ArrayPtr<void_*> space;
  ArrayPtr<const_unsigned_char> local_1f8;
  size_t local_1e8;
  unsigned_long local_1e0;
  ArrayPtr<void_*const> local_1d8;
  kj *local_1c8;
  void **ppvStack_1c0;
  undefined1 auStack_1b8 [8];
  ArrayPtr<void_*const> newTrace;
  kj *pkStack_190;
  ArrayPtr<void_*> newTraceSpace;
  Array<void_*> newTraceSpace_heap;
  void *newTraceSpace_stack [40];
  bool newTraceSpace_isOnStack;
  size_t newTraceSpace_size;
  uint ignoreCount_local;
  Exception *this_local;
  
  sVar2 = size<void*,32ul>(&this->trace);
  this_00 = (kj *)(sVar2 + ignoreCount + 1);
  if (this_00 < (kj *)0x29) {
    Array<void_*>::Array((Array<void_*> *)&newTraceSpace.size_,(void *)0x0);
    AVar3 = arrayPtr<void*>(&newTraceSpace_heap.disposer,(size_t)this_00);
    pkStack_190 = (kj *)AVar3.ptr;
  }
  else {
    heapArray<void*>((Array<void_*> *)&newTraceSpace.size_,this_00,size);
    AVar3 = kj::Array::operator_cast_to_ArrayPtr((Array *)&newTraceSpace.size_);
    pkStack_190 = (kj *)AVar3.ptr;
  }
  newTraceSpace.ptr = (void **)AVar3.size_;
  local_1c8 = pkStack_190;
  ppvStack_1c0 = newTraceSpace.ptr;
  space.size_._0_4_ = ignoreCount + 1;
  space.ptr = newTraceSpace.ptr;
  space.size_._4_4_ = 0;
  AVar4 = kj::getStackTrace(pkStack_190,space,(uint)AVar3.ptr);
  newTrace.ptr = (void **)AVar4.size_;
  auStack_1b8 = (undefined1  [8])AVar4.ptr;
  sVar2 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)auStack_1b8);
  if (ignoreCount + 2 < sVar2) {
    sVar2 = size<void*,32ul>(&this->trace);
    local_1e0 = sVar2 - this->traceCount;
    local_1e8 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)auStack_1b8);
    end = min<unsigned_long,unsigned_long>(&local_1e0,&local_1e8);
    local_1d8 = ArrayPtr<void_*const>::slice((ArrayPtr<void_*const> *)auStack_1b8,0,end);
    newTrace.ptr = (void **)local_1d8.size_;
    auStack_1b8 = (undefined1  [8])local_1d8.ptr;
    uVar1 = this->traceCount;
    __src = ArrayPtr<void_*const>::begin((ArrayPtr<void_*const> *)auStack_1b8);
    local_1f8 = ArrayPtr<void_*const>::asBytes((ArrayPtr<void_*const> *)auStack_1b8);
    sVar2 = ArrayPtr<const_unsigned_char>::size(&local_1f8);
    memcpy(this->trace + uVar1,__src,sVar2);
    sVar2 = ArrayPtr<void_*const>::size((ArrayPtr<void_*const> *)auStack_1b8);
    this->traceCount = this->traceCount + (int)sVar2;
  }
  Array<void_*>::~Array((Array<void_*> *)&newTraceSpace.size_);
  return;
}

Assistant:

void Exception::extendTrace(uint ignoreCount) {
  KJ_STACK_ARRAY(void*, newTraceSpace, kj::size(trace) + ignoreCount + 1,
      sizeof(trace)/sizeof(trace[0]) + 8, 128);

  auto newTrace = kj::getStackTrace(newTraceSpace, ignoreCount + 1);
  if (newTrace.size() > ignoreCount + 2) {
    // Remove suffix that won't fit into our static-sized trace.
    newTrace = newTrace.slice(0, kj::min(kj::size(trace) - traceCount, newTrace.size()));

    // Copy the rest into our trace.
    memcpy(trace + traceCount, newTrace.begin(), newTrace.asBytes().size());
    traceCount += newTrace.size();
  }
}